

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_resize(REF_INTERP ref_interp,REF_INT max)

{
  ulong uVar1;
  REF_BOOL *pRVar2;
  REF_INT *pRVar3;
  REF_DBL *pRVar4;
  REF_STATUS RVar5;
  uint uVar6;
  
  uVar1 = (ulong)(uint)max;
  uVar6 = ref_interp->max;
  fflush(_stdout);
  if (0 < max) {
    pRVar2 = (REF_BOOL *)realloc(ref_interp->agent_hired,uVar1 * 4);
    ref_interp->agent_hired = pRVar2;
  }
  pRVar2 = ref_interp->agent_hired;
  if (pRVar2 == (REF_BOOL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xd1,
           "ref_interp_resize","realloc ref_interp->agent_hired NULL");
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar1,(long)max,4,
           (long)max * 4);
  }
  else if ((int)uVar6 < max) {
    memset(pRVar2 + (int)uVar6,0,(ulong)(~uVar6 + max) * 4 + 4);
  }
  RVar5 = 2;
  if (pRVar2 != (REF_BOOL *)0x0) {
    fflush(_stdout);
    if (0 < max) {
      pRVar3 = (REF_INT *)realloc(ref_interp->cell,uVar1 * 4);
      ref_interp->cell = pRVar3;
    }
    pRVar3 = ref_interp->cell;
    if (pRVar3 == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xd2
             ,"ref_interp_resize","realloc ref_interp->cell NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar1,(long)max,4,
             (long)max * 4);
    }
    else if ((int)uVar6 < max) {
      memset(pRVar3 + (int)uVar6,0xff,(ulong)(~uVar6 + max) * 4 + 4);
    }
    if (pRVar3 != (REF_INT *)0x0) {
      fflush(_stdout);
      if (0 < max) {
        pRVar3 = (REF_INT *)realloc(ref_interp->part,uVar1 << 2);
        ref_interp->part = pRVar3;
      }
      pRVar3 = ref_interp->part;
      if (pRVar3 == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xd3,"ref_interp_resize","realloc ref_interp->part NULL");
        printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar1,(long)max,4,
               (long)max * 4);
      }
      else if ((int)uVar6 < max) {
        memset(pRVar3 + (int)uVar6,0xff,(ulong)(~uVar6 + max) * 4 + 4);
      }
      if (pRVar3 != (REF_INT *)0x0) {
        fflush(_stdout);
        uVar6 = max * 4;
        if (0 < max) {
          pRVar4 = (REF_DBL *)realloc(ref_interp->bary,(ulong)uVar6 << 3);
          ref_interp->bary = pRVar4;
        }
        if (ref_interp->bary == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0xd4,"ref_interp_resize","realloc ref_interp->bary NULL");
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)uVar6,
                 (long)(int)uVar6,8,(long)(int)uVar6 * 8);
        }
        else {
          ref_interp->max = max;
          RVar5 = 0;
        }
      }
    }
  }
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_interp_resize(REF_INTERP ref_interp, REF_INT max) {
  REF_INT old = ref_interp_max(ref_interp);

  ref_realloc_init(ref_interp->agent_hired, old, max, REF_BOOL, REF_FALSE);
  ref_realloc_init(ref_interp->cell, old, max, REF_INT, REF_EMPTY);
  ref_realloc_init(ref_interp->part, old, max, REF_INT, REF_EMPTY);
  ref_realloc(ref_interp->bary, 4 * max, REF_DBL);

  ref_interp_max(ref_interp) = max;

  return REF_SUCCESS;
}